

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_int_Test::TestBody
          (ByteBufferTest_test_read_int_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d0;
  Message local_c8;
  int local_c0 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  AssertHelper local_78;
  Message local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_40 [8];
  ByteBuffer byte_buffer1;
  ByteBufferTest_test_read_int_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)local_40);
  local_68[1] = 0x1e240;
  local_68[0] = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"123456","byte_buffer1.ReadInt()",local_68 + 1,local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)&gtest_ar_1 + 8);
  local_c0[1] = 0xfffe1dc0;
  local_c0[0] = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_b8,"-123456","byte_buffer2.ReadInt()",local_c0 + 1,local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_int)
{
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteInt(123456);
    EXPECT_EQ(123456, byte_buffer1.ReadInt());

    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteInt(-123456);
    EXPECT_EQ(-123456, byte_buffer2.ReadInt());
}